

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTree.cpp
# Opt level: O0

void __thiscall
cali::SnapshotTree::SnapshotTreeImpl::SnapshotTreeImpl
          (SnapshotTreeImpl *this,Attribute *attr,Variant *value)

{
  SnapshotTreeNode *this_00;
  Variant *value_local;
  Attribute *attr_local;
  SnapshotTreeImpl *this_local;
  
  this_00 = (SnapshotTreeNode *)operator_new(0xb8);
  SnapshotTreeNode::SnapshotTreeNode(this_00,attr,value);
  this->m_root = this_00;
  return;
}

Assistant:

SnapshotTreeImpl(const Attribute& attr, const Variant& value) : m_root(new SnapshotTreeNode(attr, value)) {}